

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O0

void demmt_nouveau_gem_pushbuf_data(mmt_nouveau_pushbuf_data *data,void *state)

{
  uint nr_buffers_00;
  int nr_push_00;
  int nr_relocs_00;
  mmt_nouveau_pushbuf_data *pmVar1;
  drm_nouveau_gem_pushbuf_bo *buffers_00;
  uint *puVar2;
  ulong uVar3;
  uint *puVar4;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int nr_relocs;
  int nr_push;
  int nr_buffers;
  drm_nouveau_gem_pushbuf_reloc *relocs;
  mmt_buf *relocs_mmt_buf;
  drm_nouveau_gem_pushbuf_push *push;
  mmt_buf *push_mmt_buf;
  drm_nouveau_gem_pushbuf_bo *buffers;
  mmt_buf *buffers_mmt_buf;
  uint64_t used;
  int minlen;
  void *state_local;
  mmt_nouveau_pushbuf_data *data_local;
  
  if ((data->data).len < 8) {
    fprintf(_stdout,"ERROR: invalid mmt_nouveau_pushbuf_data %s\n","");
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    demmt_abort();
  }
  pmVar1 = data + 1;
  if ((ulong)(data->data).len < (ulong)*(uint *)pmVar1 + 4) {
    fprintf(_stdout,"ERROR: invalid mmt_nouveau_pushbuf_data %s\n","");
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    demmt_abort();
  }
  buffers_00 = (drm_nouveau_gem_pushbuf_bo *)((long)&data[1].data.len + 2);
  puVar2 = (uint *)((long)&buffers_00->user_priv + (ulong)*(uint *)pmVar1);
  uVar3 = (ulong)*puVar2 + 4 + (ulong)*(uint *)pmVar1 + 4;
  if ((data->data).len < uVar3) {
    fprintf(_stdout,"ERROR: invalid mmt_nouveau_pushbuf_data %s\n","");
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    demmt_abort();
  }
  puVar4 = (uint *)((long)&((drm_nouveau_gem_pushbuf_push *)(puVar2 + 1))->bo_index + (ulong)*puVar2
                   );
  if ((ulong)*puVar4 + 4 + uVar3 <= (ulong)(data->data).len) {
    nr_buffers_00 = SUB164(ZEXT416(*(uint *)pmVar1) / ZEXT816(0x28),0);
    nr_push_00 = SUB164(ZEXT416(*puVar2) / ZEXT816(0x18),0);
    nr_relocs_00 = SUB164(ZEXT416(*puVar4) / ZEXT816(0x1c),0);
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,
                "LOG: %sDRM_NOUVEAU_GEM_PUSHBUF%s data, nr_buffers: %s%d%s, nr_relocs: %s%d%s, nr_push: %s%d%s\n"
                ,colors->rname,colors->reset,colors->num,(ulong)nr_buffers_00,colors->reset,
                colors->num,CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),nr_relocs_00),
                colors->reset,colors->num,
                CONCAT44((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),nr_push_00),colors->reset);
      }
      else {
        fprintf(_stdout,
                "%64s%sDRM_NOUVEAU_GEM_PUSHBUF%s data, nr_buffers: %s%d%s, nr_relocs: %s%d%s, nr_push: %s%d%s\n"
                ," ",colors->rname,colors->reset,colors->num,
                CONCAT44((int)((ulong)in_stack_ffffffffffffff28 >> 0x20),nr_buffers_00),
                colors->reset,colors->num,
                CONCAT44((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),nr_relocs_00),colors->reset
                ,colors->num,CONCAT44((int)((ulong)in_stack_ffffffffffffff58 >> 0x20),nr_push_00),
                colors->reset);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    demmt_nouveau_decode_gem_pushbuf_data
              (nr_buffers_00,buffers_00,nr_push_00,(drm_nouveau_gem_pushbuf_push *)(puVar2 + 1),
               nr_relocs_00,(drm_nouveau_gem_pushbuf_reloc *)(puVar4 + 1));
    return;
  }
  fprintf(_stdout,"ERROR: invalid mmt_nouveau_pushbuf_data %s\n","");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  demmt_abort();
}

Assistant:

void demmt_nouveau_gem_pushbuf_data(struct mmt_nouveau_pushbuf_data *data, void *state)
{
	// compat code, mmt does not generate mmt_nouveau_pushbuf_data message anymore

	int minlen = sizeof(struct mmt_buf *);
	if (data->data.len < minlen)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}
	uint64_t used = 0;
	struct mmt_buf *buffers_mmt_buf = (void *)&data->data.data;
	used += buffers_mmt_buf->len + sizeof(*buffers_mmt_buf);
	if (used > data->data.len)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}

	struct drm_nouveau_gem_pushbuf_bo *buffers = (void *)&buffers_mmt_buf->data;
	struct mmt_buf *push_mmt_buf = ((void *)buffers) + buffers_mmt_buf->len;
	used += push_mmt_buf->len + sizeof(*push_mmt_buf);
	if (used > data->data.len)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}

	struct drm_nouveau_gem_pushbuf_push *push = (void *)&push_mmt_buf->data;
	struct mmt_buf *relocs_mmt_buf = ((void *)push) + push_mmt_buf->len;
	used += relocs_mmt_buf->len + sizeof(*relocs_mmt_buf);
	if (used > data->data.len)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}

	struct drm_nouveau_gem_pushbuf_reloc *relocs = (void *)&relocs_mmt_buf->data;

	int nr_buffers = buffers_mmt_buf->len / sizeof(buffers[0]);
	int nr_push = push_mmt_buf->len / sizeof(push[0]);
	int nr_relocs = relocs_mmt_buf->len / sizeof(relocs[0]);

	if (dump_decoded_ioctl_data)
	{
		mmt_log("%sDRM_NOUVEAU_GEM_PUSHBUF%s data, nr_buffers: %s%d%s, nr_relocs: %s%d%s, nr_push: %s%d%s\n",
				colors->rname, colors->reset, colors->num, nr_buffers, colors->reset,
				colors->num, nr_relocs, colors->reset, colors->num, nr_push, colors->reset);
	}

	demmt_nouveau_decode_gem_pushbuf_data(nr_buffers, buffers, nr_push, push, nr_relocs, relocs);
}